

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::SRGBDecodeTests::init(SRGBDecodeTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *node;
  SRGBTestCase *pSVar1;
  long lVar2;
  TestGroupConfig testGroupConfigList [2];
  TextureFormat aTStack_78 [3];
  char *local_60;
  undefined8 local_58;
  char *local_50;
  char *local_48;
  undefined8 local_40;
  
  aTStack_78[2] = (TextureFormat)0x1c9d3aa;
  local_60 = "srgb decode tests using srgba internal format";
  local_58 = 0x30000000f;
  local_50 = "sr8";
  local_48 = "srgb decode tests using sr8 internal format";
  local_40 = 0x30000000c;
  lVar2 = 0x10;
  do {
    aTStack_78[1].order = 0x14bd692;
    aTStack_78[1].type = SNORM_INT8;
    node = (TestNode *)operator_new(0x70);
    aTStack_78[1].order = 0x14bd6ab;
    aTStack_78[1].type = SNORM_INT8;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               *(char **)((long)&aTStack_78[0].order + lVar2),
               *(char **)((long)&aTStack_78[1].order + lVar2));
    aTStack_78[1].order = 0x14bd6b6;
    aTStack_78[1].type = SNORM_INT8;
    tcu::TestNode::addChild((TestNode *)this,node);
    aTStack_78[1].order = 0x14bd6c0;
    aTStack_78[1].type = SNORM_INT8;
    pSVar1 = (SRGBTestCase *)operator_new(0x158);
    aTStack_78[1].order = 0x14bd6e1;
    aTStack_78[1].type = SNORM_INT8;
    Functional::anon_unknown_0::SRGBTestCase::SRGBTestCase
              (pSVar1,(this->super_TestCaseGroup).m_context,"skipped",
               "testing for sRGB color values with sRGB texture decoding skipped",
               *(TextureFormat *)((long)&aTStack_78[2].order + lVar2));
    (pSVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__SRGBTestCase_021a9ea0;
    aTStack_78[1].order = 0x14bd6f6;
    aTStack_78[1].type = SNORM_INT8;
    tcu::TestNode::addChild(node,(TestNode *)pSVar1);
    aTStack_78[1].order = 0x14bd700;
    aTStack_78[1].type = SNORM_INT8;
    pSVar1 = (SRGBTestCase *)operator_new(0x158);
    aTStack_78[1].order = 0x14bd721;
    aTStack_78[1].type = SNORM_INT8;
    Functional::anon_unknown_0::SRGBTestCase::SRGBTestCase
              (pSVar1,(this->super_TestCaseGroup).m_context,"enabled",
               "testing for linear color values with sRGB texture decoding enabled",
               *(TextureFormat *)((long)&aTStack_78[2].order + lVar2));
    (pSVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__SRGBTestCase_021a9f70;
    aTStack_78[1].order = 0x14bd736;
    aTStack_78[1].type = SNORM_INT8;
    tcu::TestNode::addChild(node,(TestNode *)pSVar1);
    aTStack_78[1].order = 0x14bd740;
    aTStack_78[1].type = SNORM_INT8;
    pSVar1 = (SRGBTestCase *)operator_new(0x158);
    aTStack_78[1].order = 0x14bd761;
    aTStack_78[1].type = SNORM_INT8;
    Functional::anon_unknown_0::SRGBTestCase::SRGBTestCase
              (pSVar1,(this->super_TestCaseGroup).m_context,"texel_fetch",
               "testing for linear color values with sRGB texture decoding skipped",
               *(TextureFormat *)((long)&aTStack_78[2].order + lVar2));
    (pSVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__SRGBTestCase_021a9fd8;
    aTStack_78[1].order = 0x14bd776;
    aTStack_78[1].type = SNORM_INT8;
    tcu::TestNode::addChild(node,(TestNode *)pSVar1);
    aTStack_78[1].order = 0x14bd780;
    aTStack_78[1].type = SNORM_INT8;
    pSVar1 = (SRGBTestCase *)operator_new(0x158);
    aTStack_78[1].order = 0x14bd7a1;
    aTStack_78[1].type = SNORM_INT8;
    Functional::anon_unknown_0::SRGBTestCase::SRGBTestCase
              (pSVar1,(this->super_TestCaseGroup).m_context,"conversion_gpu",
               "sampling linear values and performing conversion on the gpu",
               *(TextureFormat *)((long)&aTStack_78[2].order + lVar2));
    (pSVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__SRGBTestCase_021aa040;
    aTStack_78[1].order = 0x14bd7b6;
    aTStack_78[1].type = SNORM_INT8;
    tcu::TestNode::addChild(node,(TestNode *)pSVar1);
    aTStack_78[1].order = 0x14bd7c0;
    aTStack_78[1].type = SNORM_INT8;
    pSVar1 = (SRGBTestCase *)operator_new(0x158);
    aTStack_78[1].order = 0x14bd7e1;
    aTStack_78[1].type = SNORM_INT8;
    Functional::anon_unknown_0::SRGBTestCase::SRGBTestCase
              (pSVar1,(this->super_TestCaseGroup).m_context,"toggled",
               "toggle the sRGB decoding between draw calls",
               *(TextureFormat *)((long)&aTStack_78[2].order + lVar2));
    (pSVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__SRGBTestCase_021aa0a8;
    aTStack_78[1].order = 0x14bd7f6;
    aTStack_78[1].type = SNORM_INT8;
    tcu::TestNode::addChild(node,(TestNode *)pSVar1);
    aTStack_78[1].order = 0x14bd800;
    aTStack_78[1].type = SNORM_INT8;
    pSVar1 = (SRGBTestCase *)operator_new(0x158);
    aTStack_78[1].order = 0x14bd821;
    aTStack_78[1].type = SNORM_INT8;
    Functional::anon_unknown_0::SRGBTestCase::SRGBTestCase
              (pSVar1,(this->super_TestCaseGroup).m_context,"multiple_textures",
               "upload multiple textures with different sRGB decode values and sample",
               *(TextureFormat *)((long)&aTStack_78[2].order + lVar2));
    (pSVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__SRGBTestCase_021aa110;
    aTStack_78[1].order = 0x14bd836;
    aTStack_78[1].type = SNORM_INT8;
    tcu::TestNode::addChild(node,(TestNode *)pSVar1);
    aTStack_78[1].order = 0x14bd840;
    aTStack_78[1].type = SNORM_INT8;
    pSVar1 = (SRGBTestCase *)operator_new(0x158);
    aTStack_78[1].order = 0x14bd859;
    aTStack_78[1].type = SNORM_INT8;
    Functional::anon_unknown_0::SRGBTestCase::SRGBTestCase
              (pSVar1,(this->super_TestCaseGroup).m_context,"using_sampler",
               "testing that sampler object takes priority over texture state",
               *(TextureFormat *)((long)&aTStack_78[2].order + lVar2));
    (pSVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__SRGBTestCase_021aa178;
    aTStack_78[1].order = 0x14bd86e;
    aTStack_78[1].type = SNORM_INT8;
    tcu::TestNode::addChild(node,(TestNode *)pSVar1);
    lVar2 = lVar2 + 0x18;
  } while (lVar2 == 0x28);
  return extraout_EAX;
}

Assistant:

void SRGBDecodeTests::init (void)
{
	const TestGroupConfig testGroupConfigList[] =
	{
		TestGroupConfig("srgba8",	"srgb decode tests using srgba internal format",	tcu::TextureFormat(tcu::TextureFormat::sRGBA, tcu::TextureFormat::UNORM_INT8)),
		TestGroupConfig("sr8",		"srgb decode tests using sr8 internal format",		tcu::TextureFormat(tcu::TextureFormat::sR, tcu::TextureFormat::UNORM_INT8))
	};

	// create groups for all desired internal formats, adding test cases to each
	for (std::size_t idx = 0; idx < DE_LENGTH_OF_ARRAY(testGroupConfigList); idx++)
	{
		tcu::TestCaseGroup* const testGroup = new tcu::TestCaseGroup(m_testCtx, testGroupConfigList[idx].name, testGroupConfigList[idx].description);
		tcu::TestNode::addChild(testGroup);

		testGroup->addChild(new TextureDecodeSkippedCase		(m_context, "skipped",			"testing for sRGB color values with sRGB texture decoding skipped",		testGroupConfigList[idx].internalFormat));
		testGroup->addChild(new TextureDecodeEnabledCase		(m_context, "enabled",			"testing for linear color values with sRGB texture decoding enabled",	testGroupConfigList[idx].internalFormat));
		testGroup->addChild(new TexelFetchDecodeSkippedcase		(m_context, "texel_fetch",		"testing for linear color values with sRGB texture decoding skipped",	testGroupConfigList[idx].internalFormat));
		testGroup->addChild(new GPUConversionDecodeEnabledCase	(m_context, "conversion_gpu",	"sampling linear values and performing conversion on the gpu",			testGroupConfigList[idx].internalFormat));
		testGroup->addChild(new DecodeToggledCase				(m_context, "toggled",			"toggle the sRGB decoding between draw calls",							testGroupConfigList[idx].internalFormat));
		testGroup->addChild(new DecodeMultipleTexturesCase		(m_context, "multiple_textures","upload multiple textures with different sRGB decode values and sample",testGroupConfigList[idx].internalFormat));
		testGroup->addChild(new DecodeSamplerCase				(m_context, "using_sampler",	"testing that sampler object takes priority over texture state",		testGroupConfigList[idx].internalFormat));
	}
}